

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppConstrainedResize(bool *p_open)

{
  bool bVar1;
  int i;
  ImGuiWindowFlags flags;
  bool *in_stack_00000050;
  char *in_stack_00000058;
  char *test_desc [7];
  ImGuiWindowFlags in_stack_00000324;
  bool *in_stack_00000328;
  char *in_stack_00000330;
  int in_stack_ffffffffffffff08;
  ImGuiSliderFlags in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  int iVar2;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float in_stack_ffffffffffffff20;
  float in_stack_ffffffffffffff24;
  ImVec2 *in_stack_ffffffffffffff28;
  ImVec2 *in_stack_ffffffffffffff30;
  ImVec2 local_c4;
  undefined4 local_bc;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  undefined1 local_48 [24];
  
  memcpy(local_48,&PTR_anon_var_dwarf_e77a_001fec00,0x38);
  if (ShowExampleAppConstrainedResize::type == 0) {
    ImVec2::ImVec2(&local_50,-1.0,0.0);
    ImVec2::ImVec2(&local_58,-1.0,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 1) {
    ImVec2::ImVec2(&local_60,0.0,-1.0);
    ImVec2::ImVec2(&local_68,3.4028235e+38,-1.0);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 2) {
    ImVec2::ImVec2(&local_70,100.0,100.0);
    ImVec2::ImVec2(&local_78,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 3) {
    ImVec2::ImVec2(&local_80,400.0,-1.0);
    ImVec2::ImVec2(&local_88,500.0,-1.0);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 4) {
    ImVec2::ImVec2(&local_90,-1.0,400.0);
    ImVec2::ImVec2(&local_98,-1.0,500.0);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 5) {
    ImVec2::ImVec2(&local_a0,0.0,0.0);
    ImVec2::ImVec2(&local_a8,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (ShowExampleAppConstrainedResize::type == 6) {
    ImVec2::ImVec2(&local_b0,0.0,0.0);
    ImVec2::ImVec2(&local_b8,3.4028235e+38,3.4028235e+38);
    ImGui::SetNextWindowSizeConstraints
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (ImGuiSizeCallback)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (void *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  local_bc = 0;
  if ((ShowExampleAppConstrainedResize::auto_resize & 1U) != 0) {
    local_bc = 0x40;
  }
  bVar1 = ImGui::Begin(in_stack_00000330,in_stack_00000328,in_stack_00000324);
  if (bVar1) {
    ImVec2::ImVec2(&local_c4,0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff34,200.0,200.0);
      ImGui::SetWindowSize
                ((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
    ImGui::SameLine(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff2c,0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff24,500.0,500.0);
      ImGui::SetWindowSize
                ((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
    ImGui::SameLine(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff1c,0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (bVar1) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff14,800.0,200.0);
      ImGui::SetWindowSize
                ((ImVec2 *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c);
    }
    ImGui::SetNextItemWidth(200.0);
    ImGui::Combo((char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (int *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 (char **)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    ImGui::SetNextItemWidth(200.0);
    ImGui::DragInt((char *)in_stack_ffffffffffffff30,(int *)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff24,(int)in_stack_ffffffffffffff20,
                   (int)in_stack_ffffffffffffff1c,
                   (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c);
    ImGui::Checkbox(in_stack_00000058,in_stack_00000050);
    for (iVar2 = 0; iVar2 < ShowExampleAppConstrainedResize::display_lines; iVar2 = iVar2 + 1) {
      ImGui::Text("%*sHello, sailor! Making this line long enough for the example.",
                  (ulong)(uint)(iVar2 << 2),"");
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppConstrainedResize(bool* p_open)
{
    struct CustomConstraints
    {
        // Helper functions to demonstrate programmatic constraints
        static void Square(ImGuiSizeCallbackData* data) { data->DesiredSize.x = data->DesiredSize.y = IM_MAX(data->DesiredSize.x, data->DesiredSize.y); }
        static void Step(ImGuiSizeCallbackData* data)   { float step = (float)(int)(intptr_t)data->UserData; data->DesiredSize = ImVec2((int)(data->DesiredSize.x / step + 0.5f) * step, (int)(data->DesiredSize.y / step + 0.5f) * step); }
    };

    const char* test_desc[] =
    {
        "Resize vertical only",
        "Resize horizontal only",
        "Width > 100, Height > 100",
        "Width 400-500",
        "Height 400-500",
        "Custom: Always Square",
        "Custom: Fixed Steps (100)",
    };

    static bool auto_resize = false;
    static int type = 0;
    static int display_lines = 10;
    if (type == 0) ImGui::SetNextWindowSizeConstraints(ImVec2(-1, 0),    ImVec2(-1, FLT_MAX));      // Vertical only
    if (type == 1) ImGui::SetNextWindowSizeConstraints(ImVec2(0, -1),    ImVec2(FLT_MAX, -1));      // Horizontal only
    if (type == 2) ImGui::SetNextWindowSizeConstraints(ImVec2(100, 100), ImVec2(FLT_MAX, FLT_MAX)); // Width > 100, Height > 100
    if (type == 3) ImGui::SetNextWindowSizeConstraints(ImVec2(400, -1),  ImVec2(500, -1));          // Width 400-500
    if (type == 4) ImGui::SetNextWindowSizeConstraints(ImVec2(-1, 400),  ImVec2(-1, 500));          // Height 400-500
    if (type == 5) ImGui::SetNextWindowSizeConstraints(ImVec2(0, 0),     ImVec2(FLT_MAX, FLT_MAX), CustomConstraints::Square);                     // Always Square
    if (type == 6) ImGui::SetNextWindowSizeConstraints(ImVec2(0, 0),     ImVec2(FLT_MAX, FLT_MAX), CustomConstraints::Step, (void*)(intptr_t)100); // Fixed Step

    ImGuiWindowFlags flags = auto_resize ? ImGuiWindowFlags_AlwaysAutoResize : 0;
    if (ImGui::Begin("Example: Constrained Resize", p_open, flags))
    {
        if (ImGui::Button("200x200")) { ImGui::SetWindowSize(ImVec2(200, 200)); } ImGui::SameLine();
        if (ImGui::Button("500x500")) { ImGui::SetWindowSize(ImVec2(500, 500)); } ImGui::SameLine();
        if (ImGui::Button("800x200")) { ImGui::SetWindowSize(ImVec2(800, 200)); }
        ImGui::SetNextItemWidth(200);
        ImGui::Combo("Constraint", &type, test_desc, IM_ARRAYSIZE(test_desc));
        ImGui::SetNextItemWidth(200);
        ImGui::DragInt("Lines", &display_lines, 0.2f, 1, 100);
        ImGui::Checkbox("Auto-resize", &auto_resize);
        for (int i = 0; i < display_lines; i++)
            ImGui::Text("%*sHello, sailor! Making this line long enough for the example.", i * 4, "");
    }
    ImGui::End();
}